

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.cpp
# Opt level: O2

void PAL_printf_arg_remover(va_list *ap,INT Width,INT Precision,INT Type,INT Prefix)

{
  void **ppvVar1;
  uint uVar2;
  
  if ((Precision & 0xfffffffdU) == 0xfffffffc) {
    uVar2 = (*ap)[0].gp_offset;
    if (uVar2 < 0x29) {
      (*ap)[0].gp_offset = uVar2 + 8;
    }
    else {
      ppvVar1 = &(*ap)[0].overflow_arg_area;
      *ppvVar1 = (void *)((long)*ppvVar1 + 8);
    }
  }
  if (Width + 3U < 2) {
    uVar2 = (*ap)[0].gp_offset;
    if (uVar2 < 0x29) {
      (*ap)[0].gp_offset = uVar2 + 8;
    }
    else {
      ppvVar1 = &(*ap)[0].overflow_arg_area;
      *ppvVar1 = (void *)((long)*ppvVar1 + 8);
    }
  }
  if (Type == 7) {
    uVar2 = (*ap)[0].fp_offset;
    if (uVar2 < 0xa1) {
      (*ap)[0].fp_offset = uVar2 + 0x10;
      return;
    }
  }
  else {
    uVar2 = (*ap)[0].gp_offset;
    if (uVar2 < 0x29) {
      (*ap)[0].gp_offset = uVar2 + 8;
      return;
    }
  }
  ppvVar1 = &(*ap)[0].overflow_arg_area;
  *ppvVar1 = (void *)((long)*ppvVar1 + 8);
  return;
}

Assistant:

__attribute__((no_instrument_function))
void PAL_printf_arg_remover(va_list *ap, INT Width, INT Precision, INT Type, INT Prefix)
{
    /* remove arg and precision if needed */
    if (PRECISION_STAR == Precision ||
        PRECISION_INVALID == Precision)
    {
        (void)va_arg(*ap, int);
    }
    if (WIDTH_STAR == Width ||
        WIDTH_INVALID == Width)
    {
        (void)va_arg(*ap, int);
    }
    if (Type == PFF_TYPE_FLOAT)
    {
        (void)va_arg(*ap, double);
    }
    else if (Type == PFF_TYPE_INT && Prefix == PFF_PREFIX_LONGLONG)
    {
        (void)va_arg(*ap, INT64);
    }
    else if (Type == PFF_TYPE_INT || Type == PFF_TYPE_CHAR)
    {
        (void)va_arg(*ap, int);
    }
    else
    {
        (void)va_arg(*ap, void *);
    }
}